

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O0

int Abc_NtkRetimeIncremental
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fMinDelay,int fOneStep,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  st__table *psVar5;
  int local_5c;
  int local_58;
  int nIterLimit;
  int RetValue;
  int nIdMaxStart;
  int nLatches;
  st__table *tLatches;
  Vec_Ptr_t *vBoxes;
  Abc_Ntk_t *pNtkCopy;
  int fVerbose_local;
  int fOneStep_local;
  int fMinDelay_local;
  int fForward_local;
  int nDelayLim_local;
  Abc_Ntk_t *pNtk_local;
  
  vBoxes = (Vec_Ptr_t *)0x0;
  iVar2 = Abc_NtkLatchNum(pNtk);
  iVar3 = Abc_NtkObjNumMax(pNtk);
  local_58 = -1;
  iVar4 = Abc_NtkNodeNum(pNtk);
  if (iVar4 == 0) {
    pNtk_local._4_4_ = 0;
  }
  else {
    Abc_NtkOrderCisCos(pNtk);
    if (fMinDelay != 0) {
      if (fOneStep == 0) {
        local_5c = Abc_NtkLevel(pNtk);
        local_5c = local_5c << 1;
      }
      else {
        local_5c = 1;
      }
      local_58 = local_5c;
      vBoxes = (Vec_Ptr_t *)Abc_NtkDup(pNtk);
      psVar5 = Abc_NtkRetimePrepareLatches((Abc_Ntk_t *)vBoxes);
      st__free_table(psVar5);
    }
    psVar5 = Abc_NtkRetimePrepareLatches(pNtk);
    Abc_NtkRetimeShareLatches(pNtk,0);
    pVVar1 = pNtk->vBoxes;
    pNtk->vBoxes = (Vec_Ptr_t *)0x0;
    if (fMinDelay == 0) {
      Abc_NtkRetimeOneWay(pNtk,fForward,fVerbose);
    }
    else {
      Abc_NtkRetimeMinDelay(pNtk,(Abc_Ntk_t *)vBoxes,nDelayLim,local_58,fForward,fVerbose);
      Abc_NtkDelete((Abc_Ntk_t *)vBoxes);
    }
    Abc_NtkRetimeShareLatches(pNtk,0);
    pNtk->vBoxes = pVVar1;
    iVar3 = Abc_NtkRetimeFinalizeLatches(pNtk,psVar5,iVar3);
    st__free_table(psVar5);
    if (iVar3 == 0) {
      pNtk_local._4_4_ = 0;
    }
    else {
      iVar3 = Abc_NtkCheck(pNtk);
      if (iVar3 == 0) {
        fprintf(_stdout,"Abc_NtkRetimeForward(): Network check has failed.\n");
      }
      iVar3 = Abc_NtkLatchNum(pNtk);
      pNtk_local._4_4_ = iVar2 - iVar3;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkRetimeIncremental( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fMinDelay, int fOneStep, int fVerbose )
{
    Abc_Ntk_t * pNtkCopy = NULL;
    Vec_Ptr_t * vBoxes;
    st__table * tLatches;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nIdMaxStart = Abc_NtkObjNumMax(pNtk);
    int RetValue;
    int nIterLimit = -1; // Suppress "might be used uninitialized"
    if ( Abc_NtkNodeNum(pNtk) == 0 )
        return 0;
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    if ( fMinDelay ) 
    {
        nIterLimit = fOneStep? 1 : 2 * Abc_NtkLevel(pNtk);
        pNtkCopy = Abc_NtkDup( pNtk );
        tLatches = Abc_NtkRetimePrepareLatches( pNtkCopy );
        st__free_table( tLatches );
    }
    // collect latches and remove CIs/COs
    tLatches = Abc_NtkRetimePrepareLatches( pNtk );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // save boxes
    vBoxes = pNtk->vBoxes;  pNtk->vBoxes = NULL;
    // perform the retiming
    if ( fMinDelay )
        Abc_NtkRetimeMinDelay( pNtk, pNtkCopy, nDelayLim, nIterLimit, fForward, fVerbose );
    else
        Abc_NtkRetimeOneWay( pNtk, fForward, fVerbose );
    if ( fMinDelay ) 
        Abc_NtkDelete( pNtkCopy );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // restore boxes
    pNtk->vBoxes = vBoxes;
    // finalize the latches
    RetValue = Abc_NtkRetimeFinalizeLatches( pNtk, tLatches, nIdMaxStart );
    st__free_table( tLatches );
    if ( RetValue == 0 )
        return 0;
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeForward(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}